

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

int WildMidi_SetOption(midi *handle,unsigned_short options,unsigned_short setting)

{
  _mdi *mdi;
  unsigned_short setting_local;
  unsigned_short options_local;
  midi *handle_local;
  
  if (WM_Initialized == 0) {
    _WM_ERROR("WildMidi_SetOption",0xa81,8,(char *)0x0,0);
    handle_local._4_4_ = -1;
  }
  else if (handle == (midi *)0x0) {
    _WM_ERROR("WildMidi_SetOption",0xa85,9,"(NULL handle)",0);
    handle_local._4_4_ = -1;
  }
  else {
    FCriticalSection::Enter((FCriticalSection *)handle);
    if (((options & 7) == 0) || ((options & 0xfff8) != 0)) {
      _WM_ERROR("WildMidi_SetOption",0xa8d,9,"(invalid option)",0);
      FCriticalSection::Leave((FCriticalSection *)handle);
      handle_local._4_4_ = -1;
    }
    else if ((setting & 0xfff8) == 0) {
      *(ushort *)((long)handle + 0x30) =
           *(ushort *)((long)handle + 0x30) & (options ^ 0xff) | options & setting;
      if ((options & 1) == 0) {
        if ((options & 4) != 0) {
          _WM_reset_reverb(*(_rvb **)((long)handle + 0x50378));
        }
      }
      else {
        _WM_AdjustChannelVolumes((_mdi *)handle,'\x10');
      }
      FCriticalSection::Leave((FCriticalSection *)handle);
      handle_local._4_4_ = 0;
    }
    else {
      _WM_ERROR("WildMidi_SetOption",0xa93,9,"(invalid setting)",0);
      FCriticalSection::Leave((FCriticalSection *)handle);
      handle_local._4_4_ = -1;
    }
  }
  return handle_local._4_4_;
}

Assistant:

WM_SYMBOL int WildMidi_SetOption(midi * handle, unsigned short int options,
		unsigned short int setting) {
	struct _mdi *mdi;

	if (!WM_Initialized) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_NOT_INIT, NULL, 0);
		return -1;
	}
	if (handle == NULL) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG, "(NULL handle)",
				0);
		return -1;
	}

	mdi = (struct _mdi *) handle;
	mdi->lock.Enter();
	if ((!(options & 0x0007)) || (options & 0xFFF8)) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG, "(invalid option)",
				0);
		mdi->lock.Leave();
		return -1;
	}
	if (setting & 0xFFF8) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG,
				"(invalid setting)", 0);
		mdi->lock.Leave();
		return -1;
	}

	mdi->info.mixer_options = ((mdi->info.mixer_options & (0x00FF ^ options))
			| (options & setting));

	if (options & WM_MO_LOG_VOLUME) {
		_WM_AdjustChannelVolumes(mdi, 16);	// Settings greater than 15
											// adjust all channels
	} else if (options & WM_MO_REVERB) {
		_WM_reset_reverb(mdi->reverb);
	}

	mdi->lock.Leave();
	return 0;
}